

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int X509_STORE_CTX_set_trust(X509_STORE_CTX *ctx,int trust)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (trust != 0) {
    iVar1 = X509_is_valid_trust_id(trust);
    if (iVar1 == 0) {
      iVar2 = 0;
      ERR_put_error(0xb,0,0x83,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_vfy.cc"
                    ,0x5c3);
    }
    else if ((ctx->crls->stack).num_alloc == 0) {
      (ctx->crls->stack).num_alloc = trust;
    }
  }
  return iVar2;
}

Assistant:

int X509_STORE_CTX_set_trust(X509_STORE_CTX *ctx, int trust) {
  // If |trust| is zero, this function historically silently did nothing.
  if (trust == 0) {
    return 1;
  }

  if (!X509_is_valid_trust_id(trust)) {
    OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_TRUST_ID);
    return 0;
  }

  if (ctx->param->trust == 0) {
    ctx->param->trust = trust;
  }
  return 1;
}